

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
          sample *resample,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  double *pdVar1;
  pointer pdVar2;
  double *pdVar3;
  long lVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  sample jack;
  sample local_48;
  
  last_00._M_current = (double *)resample;
  dVar8 = (double)(*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start)(this,first._M_current);
  if ((long)first._M_current - (long)this == 8) {
    __return_storage_ptr__->point = dVar8;
    __return_storage_ptr__->lower_bound = dVar8;
    __return_storage_ptr__->upper_bound = dVar8;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>),__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (&local_48,(Detail *)resample,
               (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)this,first,last_00);
    dVar9 = 0.0;
    dVar11 = 0.0;
    for (pdVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar3 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
      dVar11 = dVar11 + *pdVar3;
    }
    dVar13 = 0.0;
    if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      dVar9 = 0.0;
      pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar12 = dVar11 / (double)((long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)local_48.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3) - *pdVar2;
        dVar13 = dVar13 + dVar12 * dVar12 * dVar12;
        dVar9 = dVar9 + dVar12 * dVar12;
        pdVar2 = pdVar2 + 1;
      } while (pdVar2 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    dVar11 = pow(dVar9,1.5);
    pdVar3 = (double *)*last._M_current;
    pdVar1 = (double *)last._M_current[1];
    uVar7 = (long)pdVar1 - (long)pdVar3;
    dVar9 = 0.0;
    if (pdVar1 != pdVar3) {
      lVar4 = 0;
      do {
        lVar4 = lVar4 + (ulong)(*pdVar3 <= dVar8 && dVar8 != *pdVar3);
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != pdVar1);
      dVar9 = (double)lVar4;
    }
    iVar6 = (int)(uVar7 >> 3);
    dVar12 = (double)iVar6;
    dVar9 = dVar9 / dVar12;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      dVar9 = normal_quantile(dVar9);
      dVar10 = normal_quantile((1.0 - confidence_level) * 0.5);
      dVar13 = -dVar13 / (dVar11 * 6.0);
      dVar11 = erfc(((dVar9 + dVar10) / (dVar13 * (dVar9 + dVar10) + 1.0) + dVar9) /
                    -1.4142135623730951);
      uVar7 = lround(dVar11 * 0.5 * dVar12);
      uVar5 = 0;
      if (0 < (int)uVar7) {
        uVar5 = uVar7 & 0xffffffff;
      }
      dVar11 = erfc(((dVar9 - dVar10) / (dVar13 * (dVar9 - dVar10) + 1.0) + dVar9) /
                    -1.4142135623730951);
      lVar4 = lround(dVar11 * 0.5 * dVar12);
      iVar6 = iVar6 + -1;
      if ((int)lVar4 <= iVar6) {
        iVar6 = (int)lVar4;
      }
      __return_storage_ptr__->point = dVar8;
      dVar8 = *last._M_current;
      __return_storage_ptr__->lower_bound = *(double *)((long)dVar8 + uVar5 * 8);
      __return_storage_ptr__->upper_bound = *(double *)((long)dVar8 + (long)iVar6 * 8);
    }
    else {
      __return_storage_ptr__->point = dVar8;
      __return_storage_ptr__->lower_bound = dVar8;
      __return_storage_ptr__->upper_bound = dVar8;
    }
    __return_storage_ptr__->confidence_interval = confidence_level;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap(double confidence_level, Iterator first, Iterator last, sample const& resample, Estimator&& estimator) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares, sum_cubes;
                std::tie(sum_squares, sum_cubes) = std::accumulate(jack.begin(), jack.end(), std::make_pair(0., 0.), [jack_mean](std::pair<double, double> sqcb, double x) -> std::pair<double, double> {
                    auto d = jack_mean - x;
                    auto d2 = d * d;
                    auto d3 = d2 * d;
                    return { sqcb.first + d2, sqcb.second + d3 };
                });

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                int n = static_cast<int>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / (double)n;
                // degenerate case with uniform samples
                if (prob_n == 0) return { point, point, point, confidence_level };

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n](double x) -> int {
                    return std::lround(normal_cdf(x) * n); };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = (std::max)(cumn(a1), 0);
                auto hi = (std::min)(cumn(a2), n - 1);

                return { point, resample[lo], resample[hi], confidence_level };
            }